

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O2

void __thiscall VmModule::VmModule(VmModule *this,Allocator *allocator,char *code)

{
  LoopInfo *__s;
  
  this->code = code;
  (this->functions).head = (VmFunction *)0x0;
  (this->functions).tail = (VmFunction *)0x0;
  __s = (this->loopInfo).little;
  memset(__s,0,0x200);
  (this->loopInfo).allocator = allocator;
  (this->loopInfo).data = __s;
  (this->loopInfo).count = 0;
  (this->loopInfo).max = 0x20;
  SmallArray<VmModule::LoadStoreInfo,_32U>::SmallArray(&this->loadStoreInfo,allocator);
  (this->tempUsers).allocator = allocator;
  (this->tempUsers).data = (this->tempUsers).little;
  (this->tempUsers).count = 0;
  (this->tempUsers).max = 0x80;
  (this->tempInstructions).allocator = allocator;
  (this->tempInstructions).data = (this->tempInstructions).little;
  (this->tempInstructions).count = 0;
  (this->tempInstructions).max = 0x80;
  this->allocator = allocator;
  this->vmGlobalCodeStart = 0;
  this->regVmGlobalCodeStart = 0;
  this->skipFunctionDefinitions = false;
  this->currentFunction = (VmFunction *)0x0;
  this->currentBlock = (VmBlock *)0x0;
  this->peepholeOptimizations = 0;
  this->constantPropagations = 0;
  this->deadCodeEliminations = 0;
  this->controlFlowSimplifications = 0;
  this->loadStorePropagations = 0;
  this->commonSubexprEliminations = 0;
  this->deadAllocaStoreEliminations = 0;
  this->functionInlines = 0;
  return;
}

Assistant:

VmModule(Allocator *allocator, const char *code): code(code), loopInfo(allocator), loadStoreInfo(allocator), tempUsers(allocator), tempInstructions(allocator), allocator(allocator)
	{
		vmGlobalCodeStart = 0;
		regVmGlobalCodeStart = 0;

		skipFunctionDefinitions = false;

		currentFunction = NULL;
		currentBlock = NULL;

		peepholeOptimizations = 0;
		constantPropagations = 0;
		deadCodeEliminations = 0;
		controlFlowSimplifications = 0;
		loadStorePropagations = 0;
		commonSubexprEliminations = 0;
		deadAllocaStoreEliminations = 0;
		functionInlines = 0;
	}